

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

void closed_handle_large_write_cb(uv_write_t *req,int status)

{
  uint uVar1;
  
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x259,"status == 0");
    abort();
  }
  closed_handle_data_read = 100000;
  write_reqs_completed = write_reqs_completed + 1;
  if (write_reqs_completed == 300) {
    write_reqs_completed = 0;
    uVar1 = write_until_data_queued();
    if (uVar1 != 0) {
      send_handle_and_close();
      return;
    }
  }
  return;
}

Assistant:

static void closed_handle_large_write_cb(uv_write_t* req, int status) {
  ASSERT(status == 0);
  ASSERT(closed_handle_data_read = LARGE_SIZE);
  if (++write_reqs_completed == ARRAY_SIZE(write_reqs)) {
    write_reqs_completed = 0;
    if (write_until_data_queued() > 0)
      send_handle_and_close();
  }
}